

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O1

Adj * Omega_h::find_coarsen_domains
                (Adj *__return_storage_ptr__,Mesh *mesh,LOs *keys2verts,Int ent_dim,
                Read<signed_char> *ents_are_dead)

{
  int *piVar1;
  Alloc *pAVar2;
  size_t sVar3;
  LOs lke2ke;
  LOs ke2e;
  Read<signed_char> ke_codes;
  LOs k2ke;
  LOs k2lke;
  Write<int> lke2e;
  Write<signed_char> lke_codes;
  Write<int> lke2k;
  Write<signed_char> kes_are_live;
  Read<signed_char> ents_are_live;
  LOs ke2k;
  Adj k2e;
  Adj v2e;
  Alloc *local_2a8;
  void *local_2a0;
  Alloc *local_298;
  void *local_290;
  Alloc *local_288;
  void *local_280;
  LOs local_278;
  LOs local_268;
  LOs local_258;
  LOs local_248;
  LOs local_238;
  Alloc *local_228;
  void *local_220;
  LOs local_218;
  Write<signed_char> local_208;
  Write<int> local_1f8;
  Write<int> local_1e8;
  Alloc *local_1d8;
  void *local_1d0;
  Read<int> local_1c8;
  Alloc *local_1b8;
  void *local_1b0;
  Read<signed_char> local_1a8;
  Alloc *local_198;
  void *local_190;
  Read<int> local_188;
  Alloc *local_178;
  void *local_170;
  Write<signed_char> local_168;
  Read<signed_char> local_158;
  Alloc *local_148;
  void *local_140;
  Read<signed_char> local_138;
  Read<signed_char> local_128;
  Read<signed_char> local_118;
  Read<signed_char> local_108;
  Read<signed_char> local_f8;
  Alloc *local_e8;
  void *local_e0;
  LOs local_d8;
  Alloc *local_c8;
  void *local_c0;
  Adj local_b8;
  Adj local_88;
  Adj local_58;
  
  pAVar2 = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar3 = pAVar2->size;
  }
  else {
    sVar3 = (ulong)pAVar2 >> 3;
  }
  Mesh::ask_up(&local_58,mesh,0,ent_dim);
  local_218.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)local_218.write_.shared_alloc_.alloc & 7) == 0 &&
      local_218.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218.write_.shared_alloc_.alloc =
           (Alloc *)((local_218.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_218.write_.shared_alloc_.alloc)->use_count =
           (local_218.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_218.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
  local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_58.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b8.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_58.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b8.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_b8.codes.write_.shared_alloc_.alloc = local_58.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_58.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.codes.write_.shared_alloc_.alloc)->use_count =
           (local_58.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b8.codes.write_.shared_alloc_.direct_ptr = local_58.codes.write_.shared_alloc_.direct_ptr;
  unmap_adjacency(&local_88,&local_218,&local_b8);
  Adj::~Adj(&local_b8);
  pAVar2 = local_218.write_.shared_alloc_.alloc;
  if (((ulong)local_218.write_.shared_alloc_.alloc & 7) == 0 &&
      local_218.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_218.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_218.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_228 = local_88.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_88.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228 = (Alloc *)((local_88.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_88.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_220 = local_88.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_298 = local_88.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_88.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_298 = (Alloc *)((local_88.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_88.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_290 = local_88.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_288 = local_88.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_88.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288 = (Alloc *)((local_88.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.codes.write_.shared_alloc_.alloc)->use_count =
           (local_88.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_280 = local_88.codes.write_.shared_alloc_.direct_ptr;
  local_d8.write_.shared_alloc_.alloc = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.write_.shared_alloc_.alloc = (Alloc *)(local_228->size * 8 + 1);
    }
    else {
      local_228->use_count = local_228->use_count + 1;
    }
  }
  local_d8.write_.shared_alloc_.direct_ptr =
       local_88.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  invert_fan((Omega_h *)&local_c8,&local_d8);
  pAVar2 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_f8.write_.shared_alloc_.alloc = (ents_are_dead->write_).shared_alloc_.alloc;
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.write_.shared_alloc_.alloc =
           (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.write_.shared_alloc_.alloc)->use_count =
           (local_f8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.write_.shared_alloc_.direct_ptr = (ents_are_dead->write_).shared_alloc_.direct_ptr;
  invert_marks((Omega_h *)&local_e8,&local_f8);
  pAVar2 = local_f8.write_.shared_alloc_.alloc;
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_238.write_.shared_alloc_.alloc = local_298;
  if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_238.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
    }
    else {
      local_298->use_count = local_298->use_count + 1;
    }
  }
  local_238.write_.shared_alloc_.direct_ptr = local_290;
  local_158.write_.shared_alloc_.alloc = local_e8;
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158.write_.shared_alloc_.alloc = (Alloc *)(local_e8->size * 8 + 1);
    }
    else {
      local_e8->use_count = local_e8->use_count + 1;
    }
  }
  local_158.write_.shared_alloc_.direct_ptr = local_e0;
  unmap<signed_char>((Omega_h *)&local_148,&local_238,&local_158,1);
  pAVar2 = local_158.write_.shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_238.write_.shared_alloc_.alloc;
  if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
      local_238.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_238.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_238.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_168.shared_alloc_.alloc = local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168.shared_alloc_.alloc = (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  local_168.shared_alloc_.direct_ptr = local_140;
  Read<signed_char>::Read(&local_108,&local_168);
  collect_marked((Omega_h *)&local_2a8,&local_108);
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_108.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
      operator_delete(local_108.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_168.shared_alloc_.alloc;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_248.write_.shared_alloc_.alloc = local_2a8;
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
    }
    else {
      local_2a8->use_count = local_2a8->use_count + 1;
    }
  }
  local_248.write_.shared_alloc_.direct_ptr = local_2a0;
  local_188.write_.shared_alloc_.alloc = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188.write_.shared_alloc_.alloc = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_188.write_.shared_alloc_.direct_ptr = local_c0;
  unmap<int>((Omega_h *)&local_178,&local_248,&local_188,1);
  pAVar2 = local_188.write_.shared_alloc_.alloc;
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_248.write_.shared_alloc_.alloc;
  if (((ulong)local_248.write_.shared_alloc_.alloc & 7) == 0 &&
      local_248.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_248.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_248.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_258.write_.shared_alloc_.alloc = local_2a8;
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
    }
    else {
      local_2a8->use_count = local_2a8->use_count + 1;
    }
  }
  local_258.write_.shared_alloc_.direct_ptr = local_2a0;
  local_1a8.write_.shared_alloc_.alloc = local_288;
  if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.write_.shared_alloc_.alloc = (Alloc *)(local_288->size * 8 + 1);
    }
    else {
      local_288->use_count = local_288->use_count + 1;
    }
  }
  local_1a8.write_.shared_alloc_.direct_ptr = local_280;
  unmap<signed_char>((Omega_h *)&local_198,&local_258,&local_1a8,1);
  pAVar2 = local_1a8.write_.shared_alloc_.alloc;
  if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_258.write_.shared_alloc_.alloc;
  if (((ulong)local_258.write_.shared_alloc_.alloc & 7) == 0 &&
      local_258.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_258.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_258.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_268.write_.shared_alloc_.alloc = local_2a8;
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_268.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
    }
    else {
      local_2a8->use_count = local_2a8->use_count + 1;
    }
  }
  local_268.write_.shared_alloc_.direct_ptr = local_2a0;
  local_1c8.write_.shared_alloc_.alloc = local_298;
  if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
    }
    else {
      local_298->use_count = local_298->use_count + 1;
    }
  }
  local_1c8.write_.shared_alloc_.direct_ptr = local_290;
  unmap<int>((Omega_h *)&local_1b8,&local_268,&local_1c8,1);
  pAVar2 = local_1c8.write_.shared_alloc_.alloc;
  if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_268.write_.shared_alloc_.alloc;
  if (((ulong)local_268.write_.shared_alloc_.alloc & 7) == 0 &&
      local_268.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_1e8.shared_alloc_.alloc = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8.shared_alloc_.alloc = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  local_1e8.shared_alloc_.direct_ptr = local_170;
  Read<int>::Read(&local_118,&local_1e8);
  invert_funnel((Omega_h *)&local_1d8,(LOs *)&local_118,(LO)(sVar3 >> 2));
  if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_118.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
      operator_delete(local_118.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_1e8.shared_alloc_.alloc;
  if (((ulong)local_1e8.shared_alloc_.alloc & 7) == 0 &&
      local_1e8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1e8.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_278.write_.shared_alloc_.alloc = local_1d8;
  if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_278.write_.shared_alloc_.alloc = (Alloc *)(local_1d8->size * 8 + 1);
    }
    else {
      local_1d8->use_count = local_1d8->use_count + 1;
    }
  }
  local_278.write_.shared_alloc_.direct_ptr = local_1d0;
  local_1f8.shared_alloc_.alloc = local_1b8;
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.shared_alloc_.alloc = (Alloc *)(local_1b8->size * 8 + 1);
    }
    else {
      local_1b8->use_count = local_1b8->use_count + 1;
    }
  }
  local_1f8.shared_alloc_.direct_ptr = local_1b0;
  Read<int>::Read(&local_128,&local_1f8);
  local_208.shared_alloc_.alloc = local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208.shared_alloc_.alloc = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_208.shared_alloc_.direct_ptr = local_190;
  Read<signed_char>::Read(&local_138,&local_208);
  Adj::Adj(__return_storage_ptr__,&local_278,(LOs *)&local_128,&local_138);
  if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
      local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_138.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
      operator_delete(local_138.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_208.shared_alloc_.alloc;
  if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
      local_208.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_208.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_208.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
      local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_128.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_128.write_.shared_alloc_.alloc);
      operator_delete(local_128.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_1f8.shared_alloc_.alloc;
  if (((ulong)local_1f8.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1f8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f8.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_278.write_.shared_alloc_.alloc;
  if (((ulong)local_278.write_.shared_alloc_.alloc & 7) == 0 &&
      local_278.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_278.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_278.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
    piVar1 = &local_1d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1d8);
      operator_delete(local_1d8,0x48);
    }
  }
  if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
    piVar1 = &local_1b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8);
      operator_delete(local_1b8,0x48);
    }
  }
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    piVar1 = &local_198->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198);
      operator_delete(local_198,0x48);
    }
  }
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    piVar1 = &local_178->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178);
      operator_delete(local_178,0x48);
    }
  }
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
    piVar1 = &local_2a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2a8);
      operator_delete(local_2a8,0x48);
    }
  }
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    piVar1 = &local_148->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148);
      operator_delete(local_148,0x48);
    }
  }
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
    piVar1 = &local_e8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8);
      operator_delete(local_e8,0x48);
    }
  }
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    piVar1 = &local_c8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8);
      operator_delete(local_c8,0x48);
    }
  }
  pAVar2 = local_288;
  if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
    piVar1 = &local_288->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_288);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_298;
  if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
    piVar1 = &local_298->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    piVar1 = &local_228->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_228);
      operator_delete(pAVar2,0x48);
    }
  }
  Adj::~Adj(&local_88);
  Adj::~Adj(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Adj find_coarsen_domains(
    Mesh* mesh, LOs keys2verts, Int ent_dim, Read<I8> ents_are_dead) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, ent_dim);
  auto k2e = unmap_adjacency(keys2verts, v2e);
  auto k2ke = k2e.a2ab;
  auto ke2e = k2e.ab2b;
  auto ke_codes = k2e.codes;
  auto ke2k = invert_fan(k2ke);
  auto ents_are_live = invert_marks(ents_are_dead);
  auto kes_are_live = unmap(ke2e, ents_are_live, 1);
  auto lke2ke = collect_marked(kes_are_live);
  auto lke2k = unmap(lke2ke, ke2k, 1);
  auto lke_codes = unmap(lke2ke, ke_codes, 1);
  auto lke2e = unmap(lke2ke, ke2e, 1);
  auto k2lke = invert_funnel(lke2k, nkeys);
  return Adj(k2lke, lke2e, lke_codes);
}